

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpDef.cpp
# Opt level: O0

string * Liby::http::getMimeType(string *__return_storage_ptr__,string *uri)

{
  undefined8 uVar1;
  bool bVar2;
  char *__beg;
  char *__end;
  pointer ppVar3;
  allocator local_91;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_90;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_88;
  iterator it;
  undefined1 local_78 [8];
  string type;
  allocator local_41;
  long local_40;
  unsigned_long ops;
  string ret;
  string *uri_local;
  
  ret.field_2._8_8_ = uri;
  std::__cxx11::string::string((string *)&ops);
  local_40 = std::__cxx11::string::rfind((char)ret.field_2._8_8_,0x2e);
  if (local_40 == -1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"text/plain",&local_41);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    type.field_2._8_4_ = 1;
  }
  else {
    __beg = (char *)std::__cxx11::string::operator[](ret.field_2._8_8_);
    uVar1 = ret.field_2._8_8_;
    std::__cxx11::string::size();
    __end = (char *)std::__cxx11::string::operator[](uVar1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<char_const*,void>
              ((string *)local_78,__beg,__end,
               (allocator<char> *)
               ((long)&it.
                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                       ._M_cur + 7));
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&it.
                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                       ._M_cur + 7));
    local_88._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find(&file_mime_abi_cxx11_,(key_type *)local_78);
    local_90._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end(&file_mime_abi_cxx11_);
    bVar2 = std::__detail::operator==(&local_88,&local_90);
    if (bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,"text/plain",&local_91);
      std::allocator<char>::~allocator((allocator<char> *)&local_91);
    }
    else {
      ppVar3 = std::__detail::
               _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
               ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
                             *)&local_88);
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&ppVar3->second);
    }
    type.field_2._8_4_ = 1;
    std::__cxx11::string::~string((string *)local_78);
  }
  std::__cxx11::string::~string((string *)&ops);
  return __return_storage_ptr__;
}

Assistant:

std::string Liby::http::getMimeType(const std::string &uri) {
    std::string ret;
    unsigned long ops;
    ops = uri.rfind('.');
    if (ops == std::string::npos) {
        return "text/plain";
    } else {
        std::string type(&uri[ops], &uri[uri.size()]);
        auto it = file_mime.find(type);
        if (it == file_mime.end()) {
            return "text/plain";
        } else {
            return it->second;
        }
    }
}